

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O1

set<Addr,_std::less<Addr>,_std::allocator<Addr>_> * __thiscall
BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
FindGreater(set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *__return_storage_ptr__,
           BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k,bool EQ)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  char *pcVar3;
  char cVar4;
  pointer pcVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  _Alloc_hider _Var11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  long lVar13;
  long lVar14;
  Addr Cp;
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> C;
  Addr local_e8;
  long local_e0;
  long local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  IndexNode(&local_90,this->N);
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  if ((this->RootAddr).FileOff != -1) {
    if (EQ) {
      paVar12 = &local_d0.field_2;
      pcVar5 = (k->_M_dataplus)._M_p;
      local_d0._M_dataplus._M_p = (pointer)paVar12;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,pcVar5,pcVar5 + k->_M_string_length);
      iVar6 = FindFirstKey(this,&local_d0,&local_e8);
      _Var11._M_p = local_d0._M_dataplus._M_p;
    }
    else {
      paVar12 = &local_b0.field_2;
      pcVar5 = (k->_M_dataplus)._M_p;
      local_b0._M_dataplus._M_p = (pointer)paVar12;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,pcVar5,pcVar5 + k->_M_string_length);
      iVar6 = FindNextKey(this,&local_b0,&local_e8);
      _Var11._M_p = local_b0._M_dataplus._M_p;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var11._M_p != paVar12) {
      operator_delete(_Var11._M_p,paVar12->_M_allocated_capacity + 1);
    }
    if (iVar6 != -1) {
      FindNode(this,local_e8,&local_90);
      do {
        lVar13 = (long)iVar6;
        local_d8 = lVar13 + 1;
        local_e0 = lVar13 * 8;
        do {
          uVar7 = this->N - 1;
          uVar9 = (ulong)uVar7;
          iVar10 = iVar6;
          if (iVar6 < (int)uVar7) {
            cVar4 = local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar13];
            lVar14 = local_e0;
            lVar2 = local_d8;
            while (cVar4 == '1') {
              std::_Rb_tree<Addr,Addr,std::_Identity<Addr>,std::less<Addr>,std::allocator<Addr>>::
              _M_insert_unique<Addr_const&>
                        ((_Rb_tree<Addr,Addr,std::_Identity<Addr>,std::less<Addr>,std::allocator<Addr>>
                          *)__return_storage_ptr__,
                         (Addr *)((long)&(local_90.p.super__Vector_base<Addr,_std::allocator<Addr>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->BlockNum +
                                 lVar14));
              iVar10 = (int)lVar2;
              uVar9 = (long)this->N - 1;
              if ((long)uVar9 <= lVar2) break;
              lVar14 = lVar14 + 8;
              pcVar3 = local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar2;
              lVar2 = lVar2 + 1;
              cVar4 = *pcVar3;
            }
          }
          iVar8 = (int)uVar9;
          if (((iVar10 == iVar8) ||
              (local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start[iVar10] == '0')) &&
             (local_90.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
              super__Vector_impl_data._M_start[iVar8].FileOff == -1)) goto LAB_0012af54;
        } while ((iVar10 != iVar8) &&
                (local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar10] != '0'));
        iVar6 = 0;
        FindNode(this,local_90.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar8],&local_90);
      } while( true );
    }
    std::_Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>::clear
              (&__return_storage_ptr__->_M_t);
  }
LAB_0012af54:
  if (local_90.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_90.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_90.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_90.k);
  return __return_storage_ptr__;
}

Assistant:

set<Addr> BpTree<K>::FindGreater(K k, bool EQ) {
	IndexNode<K> C(N);
	set<Addr> ret;
	int i, pos;
	Addr Cp;
	if (this->RootAddr.FileOff == -1)
		return ret;
	if (EQ == false) {
		pos = this->FindNextKey(k, Cp);
	}
	else {
		pos = this->FindFirstKey(k, Cp);
	}
    if(pos == -1){
        ret.clear();
        return ret;
    }
	this->FindNode(Cp, C);
	while (1) {
		for (i = pos; i < N - 1 && C.v[i] == '1'; i++) {
			ret.insert(C.p[i]);
		}
		if ((i == N - 1 || C.v[i] == '0') && C.p[N - 1].FileOff == -1) {
			break;
		}
		else if (i == N - 1 || C.v[i] == '0') {
			pos = 0;
			this->FindNode(C.p[N - 1], C);
		}
	}
	return ret;
}